

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  char *__s;
  pointer ppDVar1;
  byte bVar2;
  bool bVar3;
  _Head_base<0UL,_ODDLParser::Property_*,_false> _Var4;
  Text *this_00;
  byte bVar5;
  byte *pbVar6;
  size_t sVar7;
  byte *pbVar8;
  _Head_base<0UL,_ODDLParser::Property_*,_false> _Var9;
  DDLNode *parent;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> first;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prev;
  string type;
  Property *prop_;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> name;
  Text *id;
  Name *name_;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_b0;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_a8;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_a0;
  DDLNode *local_98;
  string local_90;
  OpenDDLParser *local_70;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_68;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> local_60;
  Text *local_58;
  string local_50;
  
  if (in == end || in == (char *)0x0) {
    return in;
  }
  local_58 = (Text *)0x0;
  pbVar6 = (byte *)parseIdentifier(in,end,&local_58);
  this_00 = local_58;
  pbVar8 = pbVar6;
  while (((pbVar6 != (byte *)end && (pbVar8 = pbVar6, (ulong)*pbVar6 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    pbVar8 = (byte *)end;
  }
  if (local_58 == (Text *)0x0) {
    return (char *)pbVar8;
  }
  __s = local_58->m_buffer;
  local_70 = this;
  if (__s != (char *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar7);
    ppDVar1 = (local_70->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((local_70->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppDVar1) {
      parent = (DDLNode *)0x0;
    }
    else {
      parent = ppDVar1[-1];
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_98 = DDLNode::create(&local_90,&local_50,parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != (DDLNode *)0x0) {
      pushNode(local_70,local_98);
      bVar2 = 1;
      goto LAB_0066ddce;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"nullptr returned by creating DDLNode.",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  bVar2 = 0;
  local_98 = (DDLNode *)0x0;
LAB_0066ddce:
  Text::~Text(this_00);
  operator_delete(this_00,0x18);
  local_50._M_dataplus._M_p = (pointer)0x0;
  pbVar6 = (byte *)parseName((char *)pbVar8,end,(Name **)&local_50);
  local_60._M_t.super___uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>._M_t
  .super__Tuple_impl<0UL,_ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>.
  super__Head_base<0UL,_ODDLParser::Name_*,_false>._M_head_impl =
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)
       local_50._M_dataplus._M_p;
  if (local_50._M_dataplus._M_p != (pointer)0x0 && !(bool)(bVar2 ^ 1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,*(char **)(*(long *)(local_50._M_dataplus._M_p + 8) + 0x10),
               (allocator<char> *)&local_a8);
    DDLNode::setName(local_98,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8._M_head_impl = (Property *)0x0;
  pbVar8 = pbVar6;
  for (; pbVar6 != (byte *)end; pbVar6 = pbVar6 + 1) {
    bVar5 = *pbVar6;
    pbVar8 = pbVar6;
    if ((0x2c < (ulong)bVar5) || ((0x100100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0))
    goto LAB_0066de88;
    pbVar8 = (byte *)end;
  }
  bVar5 = *pbVar8;
LAB_0066de88:
  if (bVar5 == 0x28) {
    pbVar6 = pbVar8 + 1;
    local_b0._M_head_impl = (Property *)0x0;
    local_a0._M_head_impl = (Property *)0x0;
    if ((pbVar6 != (byte *)end) && (pbVar8[1] != 0x29)) {
      do {
        local_68._M_head_impl = (Property *)0x0;
        pbVar8 = (byte *)parseProperty((char *)pbVar6,end,&local_68._M_head_impl);
        _Var4._M_head_impl = local_b0._M_head_impl;
        local_b0._M_head_impl = local_68._M_head_impl;
        pbVar6 = pbVar8;
        if (_Var4._M_head_impl != (Property *)0x0) {
          Property::~Property(_Var4._M_head_impl);
          operator_delete(_Var4._M_head_impl,0x20);
        }
        for (; _Var4._M_head_impl = local_a0._M_head_impl, pbVar8 != (byte *)end;
            pbVar8 = pbVar8 + 1) {
          bVar5 = *pbVar8;
          pbVar6 = pbVar8;
          if ((0x2c < (ulong)bVar5) || ((0x100100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0))
          goto LAB_0066df1d;
          pbVar6 = (byte *)end;
        }
        bVar5 = *pbVar6;
LAB_0066df1d:
        if ((bVar5 != 0x29) && (bVar5 != 0x2c)) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,")","");
          logInvalidTokenError((char *)pbVar6,&local_90,local_70->m_logCallback);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          bVar3 = false;
          goto LAB_0066dfa3;
        }
        if (bVar5 != 0x2c && local_b0._M_head_impl != (Property *)0x0) {
          _Var9._M_head_impl = local_b0._M_head_impl;
          if (local_a8._M_head_impl == (Property *)0x0) {
            local_a8._M_head_impl = local_b0._M_head_impl;
            _Var9._M_head_impl = (Property *)0x0;
          }
          if (local_a0._M_head_impl == (Property *)0x0) {
            local_b0._M_head_impl = (Property *)0x0;
            local_a0._M_head_impl = _Var9._M_head_impl;
          }
          else {
            (local_a0._M_head_impl)->m_next = _Var9._M_head_impl;
            local_b0._M_head_impl = (Property *)0x0;
            local_a0._M_head_impl = (Property *)0x0;
            Property::~Property(_Var4._M_head_impl);
            operator_delete(_Var4._M_head_impl,0x20);
          }
        }
      } while ((pbVar6 != (byte *)end) && (*pbVar6 != 0x29));
    }
    pbVar6 = pbVar6 + 1;
    bVar3 = true;
LAB_0066dfa3:
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_a0);
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_b0);
    _Var4._M_head_impl = local_a8._M_head_impl;
    if (bVar3) {
      pbVar8 = pbVar6;
      if (!(bool)(bVar2 ^ 1) && local_a8._M_head_impl != (Property *)0x0) {
        local_a8._M_head_impl = (Property *)0x0;
        DDLNode::setProperties(local_98,_Var4._M_head_impl);
      }
    }
    else {
      pbVar8 = (byte *)0x0;
    }
  }
  std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
            ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
             &local_a8);
  std::unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>::~unique_ptr(&local_60);
  return (char *)pbVar8;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}